

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O0

bool anon_unknown.dwarf_90803::isIdContinuation(QChar c)

{
  long lVar1;
  Category CVar2;
  long in_FS_OFFSET;
  bool result;
  bool local_b;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_b = false;
  CVar2 = QChar::category((QChar *)0x142f3d);
  if (((CVar2 < Mark_Enclosing) || (CVar2 - Number_DecimalDigit < 2)) ||
     (CVar2 - Letter_Uppercase < 6)) {
    local_b = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_b;
}

Assistant:

static bool isIdContinuation(QChar c)
    {
        bool result = false;
        switch (c.category()) {
        case QChar::Letter_Uppercase:
        case QChar::Letter_Lowercase:
        case QChar::Letter_Titlecase:
        case QChar::Letter_Modifier:
        case QChar::Letter_Other:
        case QChar::Number_Letter:
        case QChar::Mark_NonSpacing:
        case QChar::Mark_SpacingCombining:
        case QChar::Number_DecimalDigit:
        case QChar::Punctuation_Connector: // '_'
            result = true;
            break;
        default:
            break;
        }
        return result;
    }